

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::NetStateRule::InternalSerializeWithCachedSizesToArray
          (NetStateRule *this,bool deterministic,uint8 *target)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  void *pvVar5;
  bool bVar6;
  Type *pTVar7;
  uint8 *puVar8;
  byte *pbVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    uVar10 = (ulong)this->phase_;
    pbVar9 = target + 1;
    *target = '\b';
    uVar12 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar9 = (byte)uVar10 | 0x80;
        uVar12 = uVar10 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar6 = 0x3fff < uVar10;
        uVar10 = uVar12;
      } while (bVar6);
    }
    *pbVar9 = (byte)uVar12;
    target = pbVar9 + 1;
  }
  if ((uVar2 & 2) != 0) {
    uVar10 = (ulong)this->min_level_;
    pbVar9 = target + 1;
    *target = 0x10;
    uVar12 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar9 = (byte)uVar10 | 0x80;
        uVar12 = uVar10 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar6 = 0x3fff < uVar10;
        uVar10 = uVar12;
      } while (bVar6);
    }
    *pbVar9 = (byte)uVar12;
    target = pbVar9 + 1;
  }
  if ((uVar2 & 4) != 0) {
    uVar10 = (ulong)this->max_level_;
    pbVar9 = target + 1;
    *target = 0x18;
    uVar12 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar9 = (byte)uVar10 | 0x80;
        uVar12 = uVar10 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar6 = 0x3fff < uVar10;
        uVar10 = uVar12;
      } while (bVar6);
    }
    *pbVar9 = (byte)uVar12;
    target = pbVar9 + 1;
  }
  iVar3 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar3) {
    pRVar1 = &this->stage_;
    iVar11 = 0;
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,iVar11);
      pcVar4 = (pTVar7->_M_dataplus)._M_p;
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,iVar11);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (pcVar4,(int)pTVar7->_M_string_length,SERIALIZE,"caffe.NetStateRule.stage");
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,iVar11);
      *target = 0x22;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar7,target + 1);
      iVar11 = iVar11 + 1;
    } while (iVar3 != iVar11);
  }
  iVar3 = (this->not_stage_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar3) {
    pRVar1 = &this->not_stage_;
    iVar11 = 0;
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,iVar11);
      pcVar4 = (pTVar7->_M_dataplus)._M_p;
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,iVar11);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (pcVar4,(int)pTVar7->_M_string_length,SERIALIZE,"caffe.NetStateRule.not_stage");
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,iVar11);
      *target = 0x2a;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar7,target + 1);
      iVar11 = iVar11 + 1;
    } while (iVar3 != iVar11);
  }
  pvVar5 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    puVar8 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe),target);
    return puVar8;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* NetStateRule::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.NetStateRule)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.Phase phase = 1;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->phase(), target);
  }

  // optional int32 min_level = 2;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->min_level(), target);
  }

  // optional int32 max_level = 3;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->max_level(), target);
  }

  // repeated string stage = 4;
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->stage(i).data(), this->stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetStateRule.stage");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(4, this->stage(i), target);
  }

  // repeated string not_stage = 5;
  for (int i = 0, n = this->not_stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->not_stage(i).data(), this->not_stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetStateRule.not_stage");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(5, this->not_stage(i), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.NetStateRule)
  return target;
}